

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int MatroskaDemuxer::matroska_ebmlnum_uint(uint8_t *data,int32_t size,uint64_t *num)

{
  ulong local_48;
  uint64_t total;
  uint64_t len_mask;
  int local_30;
  int num_ffs;
  int n;
  int read;
  uint64_t *num_local;
  int32_t size_local;
  uint8_t *data_local;
  
  num_ffs = 1;
  local_30 = 1;
  total = 0x80;
  if (size < 1) {
    data_local._4_4_ = -1;
  }
  else {
    for (; num_ffs < 9 && (*data & total) == 0; num_ffs = num_ffs + 1) {
      total = total >> 1;
    }
    if (num_ffs < 9) {
      local_48 = total - 1 & (ulong)*data;
      len_mask._4_4_ = (uint)(local_48 == total - 1);
      if (size < num_ffs) {
        data_local._4_4_ = -1;
      }
      else {
        for (; local_30 < num_ffs; local_30 = local_30 + 1) {
          if (data[local_30] == 0xff) {
            len_mask._4_4_ = len_mask._4_4_ + 1;
          }
          local_48 = local_48 << 8 | (ulong)data[local_30];
        }
        if (num_ffs == len_mask._4_4_) {
          *num = 0xffffffffffffffff;
        }
        else {
          *num = local_48;
        }
        data_local._4_4_ = num_ffs;
      }
    }
    else {
      data_local._4_4_ = -1;
    }
  }
  return data_local._4_4_;
}

Assistant:

int MatroskaDemuxer::matroska_ebmlnum_uint(const uint8_t *data, const int32_t size, uint64_t *num)
{
    int read = 1, n = 1, num_ffs = 0;
    uint64_t len_mask = 0x80;

    if (size <= 0)
        return AVERROR_INVALIDDATA;

    uint64_t total = data[0];
    while (read <= 8 && !(total & len_mask))
    {
        read++;
        len_mask >>= 1;
    }
    if (read > 8)
        return AVERROR_INVALIDDATA;

    if ((total &= (len_mask - 1)) == len_mask - 1)
        num_ffs++;
    if (size < read)
        return AVERROR_INVALIDDATA;
    while (n < read)
    {
        if (data[n] == 0xff)
            num_ffs++;
        total = (total << 8) | data[n];
        n++;
    }

    if (read == num_ffs)
        *num = ULLONG_MAX;
    else
        *num = total;

    return read;
}